

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

double __thiscall
ON_PlaneEquation::MaximumAbsoluteValueAt
          (ON_PlaneEquation *this,bool bRational,int point_count,int point_stride,double *points,
          double stop_value)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = -1.23432101234321e+308;
  if ((0 < point_count) && (points != (double *)0x0 && (int)(bRational + 3) <= point_stride)) {
    if (1.23432101234321e+308 <= ABS(stop_value)) {
      if (bRational) {
        dVar4 = points[3];
        dVar5 = (double)(~-(ulong)(dVar4 != 0.0) & 0x3ff0000000000000 |
                        (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
        dVar5 = ABS(dVar5 * this->z * points[2] +
                    this->x * dVar5 * *points + dVar5 * this->y * points[1] + dVar4);
        iVar3 = point_count + -1;
        if (iVar3 == 0) {
          return dVar5;
        }
        pdVar2 = points + (ulong)(uint)point_stride + 3;
        do {
          dVar4 = *pdVar2;
          dVar1 = (double)(~-(ulong)(dVar4 != 0.0) & 0x3ff0000000000000 |
                          (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
          dVar4 = ABS(dVar1 * this->z * pdVar2[-1] +
                      this->x * dVar1 * pdVar2[-3] + this->y * dVar1 * pdVar2[-2] + dVar4);
          if (dVar4 <= dVar5) {
            dVar4 = dVar5;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
          dVar5 = dVar4;
        } while (iVar3 != 0);
      }
      else {
        dVar4 = ABS(points[2] * this->z + *points * this->x + points[1] * this->y + this->d);
        iVar3 = point_count + -1;
        if (iVar3 == 0) {
          return dVar4;
        }
        pdVar2 = points + (ulong)(uint)point_stride + 2;
        do {
          dVar5 = ABS(*pdVar2 * this->z + pdVar2[-2] * this->x + pdVar2[-1] * this->y + this->d);
          if (dVar5 <= dVar4) {
            dVar5 = dVar4;
          }
          dVar4 = dVar5;
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    else if (bRational) {
      dVar4 = points[3];
      dVar5 = (double)(~-(ulong)(dVar4 != 0.0) & 0x3ff0000000000000 |
                      (ulong)(1.0 / dVar4) & -(ulong)(dVar4 != 0.0));
      dVar4 = ABS(dVar5 * this->z * points[2] +
                  this->x * dVar5 * *points + dVar5 * this->y * points[1] + dVar4);
      if ((dVar4 <= stop_value) && (iVar3 = point_count + -1, iVar3 != 0)) {
        pdVar2 = points + (ulong)(uint)point_stride + 3;
        do {
          dVar5 = *pdVar2;
          dVar1 = (double)(~-(ulong)(dVar5 != 0.0) & 0x3ff0000000000000 |
                          (ulong)(1.0 / dVar5) & -(ulong)(dVar5 != 0.0));
          dVar5 = ABS(dVar1 * this->z * pdVar2[-1] +
                      this->x * dVar1 * pdVar2[-3] + this->y * dVar1 * pdVar2[-2] + dVar5);
          if ((dVar4 < dVar5) && (dVar4 = dVar5, stop_value < dVar5)) {
            return dVar5;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
    else {
      dVar4 = ABS(points[2] * this->z + *points * this->x + points[1] * this->y + this->d);
      if ((dVar4 <= stop_value) && (iVar3 = point_count + -1, iVar3 != 0)) {
        pdVar2 = points + (ulong)(uint)point_stride + 2;
        do {
          dVar5 = ABS(*pdVar2 * this->z + pdVar2[-2] * this->x + pdVar2[-1] * this->y + this->d);
          if ((dVar4 < dVar5) && (dVar4 = dVar5, stop_value < dVar5)) {
            return dVar5;
          }
          pdVar2 = pdVar2 + (uint)point_stride;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
    }
  }
  return dVar4;
}

Assistant:

double ON_PlaneEquation::MaximumAbsoluteValueAt(
  bool bRational,
  int point_count,
  int point_stride,
  const double* points,
  double stop_value
  ) const
{
  double value, max_value, w;

  if (    point_count < 1 
       || point_stride < (bRational?4:3) 
       || 0 == points
       )
  {
    return ON_UNSET_VALUE;
  }

  if ( ON_IsValid(stop_value) )
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      if ( max_value > stop_value )
        return max_value;
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
        {
          if ( (max_value = value) > stop_value )
            return max_value;
        }
      }
    }
  }
  else
  {
    if ( bRational )
    {
      w = points[3];
      w = (0.0 != w) ? 1.0/w : 1.0;
      max_value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        w = points[3];
        w = (0.0 != w) ? 1.0/w : 1.0;
        value = fabs(x*w*points[0]+y*w*points[1]+z*w*points[2]+points[3]);
        if ( value > max_value )
          max_value = value;
      }
    }
    else
    {
      max_value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
      for(point_count--; point_count--; /*empty iterator*/ )
      {
        points += point_stride;
        value = fabs(x*points[0]+y*points[1]+z*points[2]+d);
        if ( value > max_value )
          max_value = value;
      }
    }
  }

  return max_value;
}